

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O0

void __thiscall wasm::StackIROptimizer::removeUnneededBlocks(StackIROptimizer *this)

{
  vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> *pvVar1;
  bool bVar2;
  reference ppSVar3;
  Block *pBVar4;
  size_type sVar5;
  Block *block;
  StackInst **inst_1;
  iterator __end1_1;
  iterator __begin1_1;
  StackIR *__range1_1;
  StackInst **inst;
  iterator __end1;
  iterator __begin1;
  StackIR *__range1;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  targets;
  StackIROptimizer *this_local;
  
  targets._M_h._M_single_bucket = (__node_base_ptr)this;
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&__range1);
  pvVar1 = this->insts;
  __end1 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::begin(pvVar1);
  inst = (StackInst **)
         std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::end(pvVar1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
                                     *)&inst), bVar2) {
    ppSVar3 = __gnu_cxx::
              __normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
              ::operator*(&__end1);
    if (*ppSVar3 != (StackInst *)0x0) {
      BranchUtils::operateOnScopeNameUses<wasm::StackIROptimizer::removeUnneededBlocks()::__0>
                ((*ppSVar3)->origin,
                 (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)&__range1);
    }
    __gnu_cxx::
    __normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
    ::operator++(&__end1);
  }
  pvVar1 = this->insts;
  __end1_1 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::begin(pvVar1);
  inst_1 = (StackInst **)
           std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::end(pvVar1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
                             *)&inst_1), bVar2) {
    ppSVar3 = __gnu_cxx::
              __normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
              ::operator*(&__end1_1);
    if (((*ppSVar3 != (StackInst *)0x0) &&
        (pBVar4 = Expression::dynCast<wasm::Block>((*ppSVar3)->origin), pBVar4 != (Block *)0x0)) &&
       ((bVar2 = IString::is(&(pBVar4->name).super_IString), !bVar2 ||
        (sVar5 = std::
                 unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                 ::count((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                          *)&__range1,&pBVar4->name), sVar5 == 0)))) {
      *ppSVar3 = (StackInst *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
    ::operator++(&__end1_1);
  }
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&__range1);
  return;
}

Assistant:

void StackIROptimizer::removeUnneededBlocks() {
  // First, find all branch targets.
  std::unordered_set<Name> targets;
  for (auto*& inst : insts) {
    if (inst) {
      BranchUtils::operateOnScopeNameUses(
        inst->origin, [&](Name& name) { targets.insert(name); });
    }
  }

  // Remove untargeted blocks.
  for (auto*& inst : insts) {
    if (!inst) {
      continue;
    }
    if (auto* block = inst->origin->dynCast<Block>()) {
      if (!block->name.is() || !targets.count(block->name)) {
        // TODO optimize, maybe run remove-unused-names
        inst = nullptr;
      }
    }
  }
}